

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa.c
# Opt level: O0

exr_result_t
internal_exr_undo_dwab
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  exr_decode_pipeline_t *in_RDI;
  DwaCompressor dwaa;
  exr_result_t rv;
  uint64_t in_stack_000001b0;
  void *in_stack_000001b8;
  uint64_t in_stack_000001c0;
  uint8_t *in_stack_000001c8;
  DwaCompressor *in_stack_000001d0;
  exr_encode_pipeline_t *encode;
  DwaCompressor *me;
  DwaCompressor *in_stack_ffffffffffffff18;
  size_t *in_stack_ffffffffffffff20;
  void **in_stack_ffffffffffffff28;
  exr_transcoding_pipeline_buffer_id_t in_stack_ffffffffffffff34;
  exr_decode_pipeline_t *in_stack_ffffffffffffff38;
  exr_result_t local_2c;
  
  encode = (exr_encode_pipeline_t *)&in_RDI->scratch_buffer_1;
  me = (DwaCompressor *)&in_RDI->scratch_alloc_size_1;
  internal_exr_huf_decompress_spare_bytes();
  local_2c = internal_decode_alloc_buffer
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                        (size_t)in_stack_ffffffffffffff18);
  if (local_2c == 0) {
    local_2c = DwaCompressor_construct
                         (in_stack_ffffffffffffff18,(AcCompression)((ulong)me >> 0x20),encode,in_RDI
                         );
    if (local_2c == 0) {
      local_2c = DwaCompressor_uncompress
                           (in_stack_000001d0,in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,
                            in_stack_000001b0);
    }
    DwaCompressor_destroy(me);
  }
  return local_2c;
}

Assistant:

exr_result_t
internal_exr_undo_dwab (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t  rv;
    DwaCompressor dwaa;

    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        internal_exr_huf_decompress_spare_bytes ());
    if (rv == EXR_ERR_SUCCESS)
    {
        rv = DwaCompressor_construct (&dwaa, STATIC_HUFFMAN, NULL, decode);
        if (rv == EXR_ERR_SUCCESS)
            rv = DwaCompressor_uncompress (
                &dwaa,
                (const uint8_t*) compressed_data,
                comp_buf_size,
                uncompressed_data,
                uncompressed_size);

        DwaCompressor_destroy (&dwaa);
    }

    return rv;
}